

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O2

unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> __thiscall
duckdb::ValidityInitScan(duckdb *this,ColumnSegment *segment)

{
  block_id_t bVar1;
  BufferManager *pBVar2;
  pointer pVVar3;
  BlockHandle *pBVar4;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>_>
  local_38;
  BufferHandle local_30;
  
  make_uniq<duckdb::ValidityScanState>();
  pBVar2 = BufferManager::GetBufferManager(segment->db);
  (*pBVar2->_vptr_BufferManager[7])(&local_30,pBVar2,&segment->block);
  pVVar3 = unique_ptr<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>,_true>
           ::operator->((unique_ptr<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>,_true>
                         *)&local_38);
  BufferHandle::operator=(&pVVar3->handle,&local_30);
  BufferHandle::~BufferHandle(&local_30);
  pBVar4 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  bVar1 = pBVar4->block_id;
  pVVar3 = unique_ptr<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>,_true>
           ::operator->((unique_ptr<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>,_true>
                         *)&local_38);
  pVVar3->block_id = bVar1;
  *(tuple<duckdb::ValidityScanState_*,_std::default_delete<duckdb::ValidityScanState>_> *)this =
       local_38._M_t.
       super__Tuple_impl<0UL,_duckdb::ValidityScanState_*,_std::default_delete<duckdb::ValidityScanState>_>
       .super__Head_base<0UL,_duckdb::ValidityScanState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)this;
}

Assistant:

unique_ptr<SegmentScanState> ValidityInitScan(ColumnSegment &segment) {
	auto result = make_uniq<ValidityScanState>();
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	result->handle = buffer_manager.Pin(segment.block);
	result->block_id = segment.block->BlockId();
	return std::move(result);
}